

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double erfc1(int *ind,double *x)

{
  double dVar1;
  double dVar2;
  
  dVar1 = *x;
  erfc1::ax = ABS(dVar1);
  if (erfc1::ax <= 0.5) {
    dVar2 = dVar1 * dVar1;
    erfc1::erfc1 = (0.5 - (((((dVar2 * 7.7105849500132e-05 + -0.00133733772997339) * dVar2 +
                             0.0323076579225834) * dVar2 + 0.0479137145607681) * dVar2 +
                            0.128379167095513 + 1.0) /
                          (((dVar2 * 0.00301048631703895 + 0.0538971687740286) * dVar2 +
                           0.375795757275549) * dVar2 + 1.0)) * dVar1) + 0.5;
    if (*ind == 0) {
      return erfc1::erfc1;
    }
    dVar1 = exp(dVar2);
    erfc1::erfc1 = dVar1 * erfc1::erfc1;
    return erfc1::erfc1;
  }
  if (erfc1::ax <= 4.0) {
    erfc1::erfc1 = (((((((erfc1::ax * -1.36864857382717e-07 + 0.564195517478974) * erfc1::ax +
                        7.21175825088309) * erfc1::ax + 43.1622272220567) * erfc1::ax +
                      152.98928504694) * erfc1::ax + 339.320816734344) * erfc1::ax +
                    451.918953711873) * erfc1::ax + 300.459261020162) /
                   (((((((erfc1::ax + 12.7827273196294) * erfc1::ax + 77.0001529352295) * erfc1::ax
                       + 277.585444743988) * erfc1::ax + 638.980264465631) * erfc1::ax +
                     931.35409485061) * erfc1::ax + 790.950925327898) * erfc1::ax + 300.459260956983
                   );
  }
  else {
    if (dVar1 <= -5.6) {
      erfc1::erfc1 = 2.0;
      if (*ind == 0) {
        erfc1::erfc1 = 2.0;
        return 2.0;
      }
      dVar1 = exp(dVar1 * dVar1);
      erfc1::erfc1 = dVar1 + dVar1;
      return dVar1 + dVar1;
    }
    if ((*ind == 0) && ((100.0 < dVar1 || (dVar2 = exparg(&erfc1::K1), -dVar2 < dVar1 * dVar1)))) {
      erfc1::erfc1 = 0.0;
      return 0.0;
    }
    dVar1 = (1.0 / *x) * (1.0 / *x);
    erfc1::erfc1 = (0.564189583547756 -
                   (((((dVar1 * 2.10144126479064 + 26.2370141675169) * dVar1 + 21.3688200555087) *
                      dVar1 + 4.6580782871847) * dVar1 + 0.282094791773523) * dVar1) /
                   ((((dVar1 * 94.153775055546 + 187.11481179959) * dVar1 + 99.0191814623914) *
                     dVar1 + 18.0124575948747) * dVar1 + 1.0)) / erfc1::ax;
  }
  dVar1 = *x;
  if (*ind == 0) {
    dVar1 = dVar1 * dVar1;
    dVar2 = exp(-dVar1);
    erfc1::erfc1 = dVar2 * ((dVar1 - dVar1) + 0.5 + 0.5) * erfc1::erfc1;
    if (*x <= 0.0 && *x != 0.0) {
      erfc1::erfc1 = 2.0 - erfc1::erfc1;
    }
  }
  else if (dVar1 < 0.0) {
    dVar1 = exp(dVar1 * dVar1);
    erfc1::erfc1 = (dVar1 + dVar1) - erfc1::erfc1;
  }
  return erfc1::erfc1;
}

Assistant:

double erfc1(int *ind,double *x)
/*
-----------------------------------------------------------------------
         EVALUATION OF THE COMPLEMENTARY ERROR FUNCTION

          ERFC1(IND,X) = ERFC(X)            IF IND = 0
          ERFC1(IND,X) = EXP(X*X)*ERFC(X)   OTHERWISE
-----------------------------------------------------------------------
*/
{
static double c = .564189583547756e0;
static double a[5] = {
    .771058495001320e-04,-.133733772997339e-02,.323076579225834e-01,
    .479137145607681e-01,.128379167095513e+00
};
static double b[3] = {
    .301048631703895e-02,.538971687740286e-01,.375795757275549e+00
};
static double p[8] = {
    -1.36864857382717e-07,5.64195517478974e-01,7.21175825088309e+00,
    4.31622272220567e+01,1.52989285046940e+02,3.39320816734344e+02,
    4.51918953711873e+02,3.00459261020162e+02
};
static double q[8] = {
    1.00000000000000e+00,1.27827273196294e+01,7.70001529352295e+01,
    2.77585444743988e+02,6.38980264465631e+02,9.31354094850610e+02,
    7.90950925327898e+02,3.00459260956983e+02
};
static double r[5] = {
    2.10144126479064e+00,2.62370141675169e+01,2.13688200555087e+01,
    4.65807828718470e+00,2.82094791773523e-01
};
static double s[4] = {
    9.41537750555460e+01,1.87114811799590e+02,9.90191814623914e+01,
    1.80124575948747e+01
};
static int K1 = 1;
static double erfc1,ax,bot,e,t,top,w;
/*
     ..
     .. Executable Statements ..
*/
/*
                     ABS(X) .LE. 0.5
*/
    ax = fabs(*x);
    if(ax > 0.5e0) goto S10;
    t = *x**x;
    top = (((a[0]*t+a[1])*t+a[2])*t+a[3])*t+a[4]+1.0e0;
    bot = ((b[0]*t+b[1])*t+b[2])*t+1.0e0;
    erfc1 = 0.5e0+(0.5e0-*x*(top/bot));
    if(*ind != 0) erfc1 = exp(t)*erfc1;
    return erfc1;
S10:
/*
                  0.5 .LT. ABS(X) .LE. 4
*/
    if(ax > 4.0e0) goto S20;
    top = ((((((p[0]*ax+p[1])*ax+p[2])*ax+p[3])*ax+p[4])*ax+p[5])*ax+p[6])*ax+p[
      7];
    bot = ((((((q[0]*ax+q[1])*ax+q[2])*ax+q[3])*ax+q[4])*ax+q[5])*ax+q[6])*ax+q[
      7];
    erfc1 = top/bot;
    goto S40;
S20:
/*
                      ABS(X) .GT. 4
*/
    if(*x <= -5.6e0) goto S60;
    if(*ind != 0) goto S30;
    if(*x > 100.0e0) goto S70;
    if(*x**x > -exparg(&K1)) goto S70;
S30:
    t = pow(1.0e0/ *x,2.0);
    top = (((r[0]*t+r[1])*t+r[2])*t+r[3])*t+r[4];
    bot = (((s[0]*t+s[1])*t+s[2])*t+s[3])*t+1.0e0;
    erfc1 = (c-t*top/bot)/ax;
S40:
/*
                      FINAL ASSEMBLY
*/
    if(*ind == 0) goto S50;
    if(*x < 0.0e0) erfc1 = 2.0e0*exp(*x**x)-erfc1;
    return erfc1;
S50:
    w = *x**x;
    t = w;
    e = w-t;
    erfc1 = (0.5e0+(0.5e0-e))*exp(-t)*erfc1;
    if(*x < 0.0e0) erfc1 = 2.0e0-erfc1;
    return erfc1;
S60:
/*
             LIMIT VALUE FOR LARGE NEGATIVE X
*/
    erfc1 = 2.0e0;
    if(*ind != 0) erfc1 = 2.0e0*exp(*x**x);
    return erfc1;
S70:
/*
             LIMIT VALUE FOR LARGE POSITIVE X
                       WHEN IND = 0
*/
    erfc1 = 0.0e0;
    return erfc1;
}